

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int cigar_iref2iseq_set(uint32_t **cigar,uint32_t *cigar_max,int *icig,int *iseq,int *iref)

{
  uint uVar1;
  uint uVar2;
  int ncig;
  int cig;
  int pos;
  int *iref_local;
  int *iseq_local;
  int *icig_local;
  uint32_t *cigar_max_local;
  uint32_t **cigar_local;
  
  ncig = *iref;
  if (-1 < ncig) {
    *icig = 0;
    *iseq = 0;
    *iref = 0;
    while (*cigar < cigar_max) {
      uVar1 = **cigar & 0xf;
      uVar2 = **cigar >> 4;
      if (uVar1 == 4) {
        *cigar = *cigar + 1;
        *iseq = uVar2 + *iseq;
        *icig = 0;
      }
      else if ((uVar1 == 5) || (uVar1 == 6)) {
        *cigar = *cigar + 1;
        *icig = 0;
      }
      else if (((uVar1 == 0) || (uVar1 == 7)) || (uVar1 == 8)) {
        ncig = ncig - uVar2;
        if (ncig < 0) {
          *icig = uVar2 + ncig;
          *iseq = *icig + *iseq;
          *iref = *icig + *iref;
          return 0;
        }
        *cigar = *cigar + 1;
        *iseq = uVar2 + *iseq;
        *icig = 0;
        *iref = uVar2 + *iref;
      }
      else if (uVar1 == 1) {
        *cigar = *cigar + 1;
        *iseq = uVar2 + *iseq;
        *icig = 0;
      }
      else {
        if ((uVar1 != 2) && (uVar1 != 3)) {
          fprintf(_stderr,"todo: cigar %d\n",(ulong)uVar1);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                        ,0x5ee,
                        "int cigar_iref2iseq_set(uint32_t **, uint32_t *, int *, int *, int *)");
        }
        ncig = ncig - uVar2;
        if (ncig < 0) {
          ncig = 0;
        }
        *cigar = *cigar + 1;
        *icig = 0;
        *iref = uVar2 + *iref;
      }
    }
    *iseq = -1;
  }
  return -1;
}

Assistant:

static inline int cigar_iref2iseq_set(uint32_t **cigar, uint32_t *cigar_max, int *icig, int *iseq, int *iref)
{
    int pos = *iref;
    if ( pos < 0 ) return -1;
    *icig = 0;
    *iseq = 0;
    *iref = 0;
    while ( *cigar<cigar_max )
    {
        int cig  = (**cigar) & BAM_CIGAR_MASK;
        int ncig = (**cigar) >> BAM_CIGAR_SHIFT;

        if ( cig==BAM_CSOFT_CLIP ) { (*cigar)++; *iseq += ncig; *icig = 0; continue; }
        if ( cig==BAM_CHARD_CLIP || cig==BAM_CPAD ) { (*cigar)++; *icig = 0; continue; }
        if ( cig==BAM_CMATCH || cig==BAM_CEQUAL || cig==BAM_CDIFF )
        {
            pos -= ncig;
            if ( pos < 0 ) { *icig = ncig + pos; *iseq += *icig; *iref += *icig; return BAM_CMATCH; }
            (*cigar)++; *iseq += ncig; *icig = 0; *iref += ncig;
            continue;
        }
        if ( cig==BAM_CINS ) { (*cigar)++; *iseq += ncig; *icig = 0; continue; }
        if ( cig==BAM_CDEL || cig==BAM_CREF_SKIP )
        {
            pos -= ncig;
            if ( pos<0 ) pos = 0;
            (*cigar)++; *icig = 0; *iref += ncig;
            continue;
        }
        fprintf(stderr,"todo: cigar %d\n", cig);
        assert(0);
    }
    *iseq = -1;
    return -1;
}